

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puthread-posix.c
# Opt level: O0

void p_uthread_set_name_internal(PUThread *thread)

{
  pchar *ppVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  psize namelen;
  pboolean is_alloc;
  pint res;
  pchar *thr_name;
  PUThread *thread_local;
  
  bVar2 = false;
  _is_alloc = (thread->base).name;
  sVar4 = strlen(_is_alloc);
  if (0xf < sVar4) {
    _is_alloc = (char *)p_malloc0(sVar4 + 1);
    if (_is_alloc == (char *)0x0) {
      printf("** Error: %s **\n","PUThread::p_uthread_set_name_internal: failed to allocate memory")
      ;
      return;
    }
    ppVar1 = (thread->base).name;
    *(undefined8 *)_is_alloc = *(undefined8 *)ppVar1;
    *(undefined4 *)(_is_alloc + 8) = *(undefined4 *)(ppVar1 + 8);
    *(undefined2 *)(_is_alloc + 0xc) = *(undefined2 *)(ppVar1 + 0xc);
    _is_alloc[0xe] = ppVar1[0xe];
    bVar2 = true;
  }
  iVar3 = pthread_setname_np(thread->hdl,_is_alloc);
  if (bVar2) {
    p_free(_is_alloc);
  }
  if (iVar3 != 0) {
    printf("** Warning: %s **\n",
           "PUThread::p_uthread_set_name_internal: failed to set thread system name");
  }
  return;
}

Assistant:

void
p_uthread_set_name_internal (PUThread *thread)
{
	pchar    *thr_name = NULL;
	pint     res       = 0;
	pboolean is_alloc  = FALSE;
#ifdef PUTHREAD_MAX_NAME
	psize    namelen   = 0;
#endif

	thr_name = thread->base.name;

#ifdef PUTHREAD_MAX_NAME
	namelen  = strlen (thr_name);

	if (namelen > PUTHREAD_MAX_NAME - 1) {
		if (P_UNLIKELY ((thr_name = p_malloc0 (namelen + 1)) == NULL)) {
			P_ERROR ("PUThread::p_uthread_set_name_internal: failed to allocate memory");
			return;
		}

		memcpy (thr_name, thread->base.name, PUTHREAD_MAX_NAME - 1);

		is_alloc = TRUE;
	}
#endif

#if defined(PLIBSYS_HAS_PTHREAD_SETNAME)
#  if defined(P_OS_MAC)
	if (thread->hdl != pthread_self ())
		P_WARNING ("PUThread::p_uthread_set_name_internal: only calling thread is supported in macOS");
	else
		res = pthread_setname_np (thr_name);
#  elif defined(P_OS_NETBSD)
	res = pthread_setname_np (thread->hdl, "%s", thr_name);
#  elif defined(P_OS_TRU64) || defined(P_OS_VMS)
	res = pthread_setname_np (thread->hdl, thr_name, 0);
#  else
	res = pthread_setname_np (thread->hdl, thr_name);
#  endif
#elif defined(PLIBSYS_HAS_PTHREAD_SET_NAME)
	pthread_set_name_np (thread->hdl, thr_name);
#elif defined(PLIBSYS_HAS_PTHREAD_PRCTL)
	if (thread->hdl != pthread_self ())
		P_WARNING ("PUThread::p_uthread_set_name_internal: prctl() can be used on calling thread only");
	else
		res = prctl (PR_SET_NAME, thr_name, NULL, NULL, NULL);
#elif defined(P_OS_HAIKU)
	res = rename_thread (find_thread (NULL), thr_name);
#endif

	if (is_alloc == TRUE)
		p_free (thr_name);

	if (res != 0)
		P_WARNING ("PUThread::p_uthread_set_name_internal: failed to set thread system name");
}